

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<9,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  float local_50 [6];
  Type in0;
  undefined8 local_c;
  float local_4;
  
  pfVar2 = (float *)&in0;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 == 0x10);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    in0.m_data.m_data[0].m_data[2] = (float)*(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    in0.m_data.m_data[1].m_data[1] = (float)((ulong)*(undefined8 *)evalCtx->in[1].m_data >> 0x20);
    in0.m_data.m_data[1].m_data[2] = (float)uVar1;
    in0.m_data.m_data[1].m_data[3] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[3] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &s_constInMat2x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 == 4);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar3 != 4);
  }
  local_50[2] = in0.m_data.m_data[0].m_data[2];
  local_c = CONCAT44(in0.m_data.m_data[1].m_data[2],in0.m_data.m_data[1].m_data[1]);
  local_4 = in0.m_data.m_data[1].m_data[3];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = local_50[lVar3] + *(float *)((long)&local_c + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_50[2] = 0.0;
  local_50[3] = 1.4013e-45;
  local_50[4] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_50[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}